

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

int __thiscall Map<String,_int>::remove(Map<String,_int> *this,char *__filename)

{
  Item *this_00;
  Item *pIVar1;
  usize uVar2;
  code *pcVar3;
  int iVar4;
  Item *pIVar5;
  Item *pIVar6;
  Item *pIVar7;
  Iterator *pIVar8;
  Item *pIVar9;
  Item **ppIVar10;
  Item *pIVar11;
  
  this_00 = *(Item **)__filename;
  pIVar6 = this_00->parent;
  if (pIVar6 == (Item *)0x0) {
    ppIVar10 = &this->root;
  }
  else {
    ppIVar10 = &pIVar6->right;
    if (this_00 == pIVar6->left) {
      ppIVar10 = &pIVar6->left;
    }
  }
  if ((*ppIVar10 != this_00) &&
     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                            ,0xc9,"*cell == item"), iVar4 != 0)) goto LAB_00104664;
  pIVar5 = this_00->left;
  pIVar9 = this_00->right;
  pIVar11 = pIVar6;
  if (pIVar5 == (Item *)0x0 && pIVar9 == (Item *)0x0) {
    *ppIVar10 = (Item *)0x0;
  }
  else if (pIVar5 == (Item *)0x0) {
    *ppIVar10 = pIVar9;
    pIVar9->parent = pIVar6;
  }
  else if (pIVar9 == (Item *)0x0) {
    *ppIVar10 = pIVar5;
    pIVar5->parent = pIVar6;
  }
  else {
    if (pIVar5->height < pIVar9->height) {
      pIVar7 = this_00->next;
      if ((pIVar7->left != (Item *)0x0) &&
         (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0xe4,"!next->left"), iVar4 != 0)) {
LAB_00104664:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      pIVar11 = pIVar7->parent;
      if (pIVar11 == this_00) {
        if ((pIVar7 != pIVar9) &&
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0xe8,"next == right"), iVar4 != 0)) goto LAB_00104664;
        *ppIVar10 = pIVar7;
        pIVar7->parent = pIVar6;
        pIVar7->left = pIVar5;
        pIVar9 = pIVar5;
        pIVar11 = pIVar7;
      }
      else {
        if ((pIVar7 != pIVar11->left) &&
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0xf3,"next == nextParent->left"), iVar4 != 0)) goto LAB_00104664;
        pIVar1 = pIVar7->right;
        pIVar11->left = pIVar1;
        if (pIVar1 != (Item *)0x0) {
          pIVar1->parent = pIVar11;
        }
        *ppIVar10 = pIVar7;
        pIVar7->parent = pIVar6;
        pIVar7->left = pIVar5;
        pIVar5->parent = pIVar7;
        pIVar7->right = pIVar9;
      }
    }
    else {
      pIVar7 = this_00->prev;
      if ((pIVar7->right != (Item *)0x0) &&
         (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                ,0x10d,"!prev->right"), iVar4 != 0)) goto LAB_00104664;
      pIVar11 = pIVar7->parent;
      if (pIVar11 == this_00) {
        if ((pIVar7 != pIVar5) &&
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0x111,"prev == left"), iVar4 != 0)) goto LAB_00104664;
        *ppIVar10 = pIVar7;
        pIVar7->parent = pIVar6;
        pIVar7->right = pIVar9;
        pIVar11 = pIVar7;
      }
      else {
        if ((pIVar7 != pIVar11->right) &&
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0x11c,"prev == prevParent->right"), iVar4 != 0))
        goto LAB_00104664;
        pIVar1 = pIVar7->left;
        pIVar11->right = pIVar1;
        if (pIVar1 != (Item *)0x0) {
          pIVar1->parent = pIVar11;
        }
        *ppIVar10 = pIVar7;
        pIVar7->parent = pIVar6;
        pIVar7->right = pIVar9;
        pIVar9->parent = pIVar7;
        pIVar7->left = pIVar5;
        pIVar9 = pIVar5;
      }
    }
    pIVar9->parent = pIVar7;
    do {
      uVar2 = pIVar11->height;
      Item::updateHeightAndSlope(pIVar11);
      pIVar5 = rebal(this,pIVar11);
      if (uVar2 == pIVar5->height) {
        pIVar6 = *ppIVar10;
        Item::updateHeightAndSlope(pIVar6);
        pIVar6 = rebal(this,pIVar6);
        goto LAB_00104688;
      }
      pIVar11 = pIVar5->parent;
    } while (pIVar11 != pIVar6);
  }
  while (pIVar11 != (Item *)0x0) {
    uVar2 = pIVar11->height;
    Item::updateHeightAndSlope(pIVar11);
    pIVar6 = rebal(this,pIVar11);
    if (uVar2 == pIVar6->height) break;
LAB_00104688:
    pIVar11 = pIVar6->parent;
  }
  pIVar6 = this_00->next;
  pIVar5 = this_00->prev;
  pIVar8 = (Iterator *)&pIVar5->next;
  if (pIVar5 == (Item *)0x0) {
    pIVar8 = &this->_begin;
  }
  pIVar8->item = pIVar6;
  pIVar6->prev = pIVar5;
  this->_size = this->_size - 1;
  String::~String(&this_00->key);
  this_00->prev = this->freeItem;
  this->freeItem = this_00;
  return (int)this_00->next;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;
    Item* origParent;
    Item* parent = origParent = item->parent;
    Item** cell = parent ? (item == parent->left ? &parent->left : &parent->right) : &root;
    ASSERT(*cell == item);
    Item* left = item->left;
    Item* right = item->right;

    if(!left && !right)
    {
      *cell = 0;
      goto rebalParentUpwards;
    }

    if(!left)
    {
      *cell = right;
      right->parent = parent;
      goto rebalParentUpwards;
    }

    if(!right)
    {
      *cell = left;
      left->parent = parent;
      goto rebalParentUpwards;
    }

    if(left->height < right->height)
    {
      Item* next = item->next;
      ASSERT(!next->left);
      Item* nextParent = next->parent;
      if(nextParent == item)
      {
        ASSERT(next == right);
        *cell = next;
        next->parent = parent;

        next->left = left;
        left->parent = next;
        parent = next;
        goto rebalParent;
      }

      // unlink next
      ASSERT(next == nextParent->left);
      Item* nextRight = next->right;
      nextParent->left = nextRight;
      if(nextRight)
        nextRight->parent = nextParent;
      
      // put next in cell
      *cell = next;
      next->parent = parent;

      // link left to next left
      next->left = left;
      left->parent = next;

      // link right to next right
      next->right = right;
      right->parent = next;

      // rebal old next->parent
      parent = nextParent;
      ASSERT(parent);
      goto rebalParent;
    }
    else
    {
      Item* prev = item->prev;
      ASSERT(!prev->right);
      Item* prevParent = prev->parent;
      if(prevParent == item)
      {
        ASSERT(prev == left);
        *cell = prev;
        prev->parent = parent;

        prev->right = right;
        right->parent = prev;
        parent = prev;
        goto rebalParent;
      }

      // unlink prev
      ASSERT(prev == prevParent->right);
      Item* prevLeft = prev->left;
      prevParent->right = prevLeft;
      if(prevLeft)
        prevLeft->parent = prevParent;

      // put prev in cell
      *cell = prev;
      prev->parent = parent;

      // link right to prev right
      prev->right = right;
      right->parent = prev;

      // link left to prev left
      prev->left = left;
      left->parent = prev;

      // rebal old prev->parent
      parent = prevParent;
      ASSERT(parent);
      goto rebalParent;
    }

    // rebal parent upwards
  rebalParent:
    do
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
      {
        parent = *cell;
        parent->updateHeightAndSlope();
        parent = rebal(parent);
        parent = parent->parent;
        break;
      }
      parent = parent->parent;
    } while(parent != origParent);
  rebalParentUpwards:
    while(parent)
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
        break;
      parent = parent->parent;
    }

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;
    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }